

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward_int8_x86
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  void *pvVar8;
  int *piVar9;
  Layer *pLVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined1 uVar20;
  uint uVar21;
  _func_int **pp_Var22;
  _func_int **pp_Var23;
  _func_int *p_Var24;
  int iVar25;
  undefined4 *puVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  uint _elempack;
  int iVar31;
  float fVar32;
  int iVar33;
  Option *_elemsize;
  undefined1 (*pauVar34) [16];
  int iVar35;
  Option *opt_00;
  long lVar36;
  int iVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  long lVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  ushort uVar44;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  int iVar53;
  ushort uVar55;
  int iVar56;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ushort uVar54;
  ushort uVar57;
  undefined1 auVar48 [16];
  float fVar59;
  float fVar60;
  v4sf one;
  float fVar61;
  int iVar62;
  float fVar63;
  int iVar74;
  int iVar76;
  __m128 min;
  int iVar78;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar75;
  float fVar77;
  float fVar79;
  undefined1 auVar73 [16];
  float fVar80;
  float fVar81;
  char cVar92;
  char cVar93;
  char cVar95;
  float fVar96;
  float fVar97;
  char cVar98;
  char cVar99;
  float fVar100;
  float fVar101;
  __m128 max;
  char cVar94;
  undefined1 auVar82 [16];
  float fVar102;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar103;
  float fVar104;
  float fVar120;
  float fVar121;
  undefined1 auVar105 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar122;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  int iVar123;
  short sVar128;
  __m128 _a;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  float *local_308;
  float *local_300;
  undefined1 local_2f8 [52];
  int iStack_2c4;
  int iStack_2c0;
  undefined4 uStack_2bc;
  size_t local_2b8;
  _func_int **local_2a8;
  pointer local_2a0;
  Mat local_298;
  ulong local_248;
  pointer local_240;
  Mat local_238;
  ulong local_1e8;
  long local_1e0;
  pointer local_1d8;
  int *local_1d0;
  Allocator *local_1c8;
  int local_1c0;
  Allocator *local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  ulong local_198;
  _func_int **local_190;
  size_type local_188;
  long local_180;
  void *local_178;
  int *local_170;
  ulong local_168;
  int local_160;
  Allocator *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  ulong local_138;
  Mat local_130;
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  short sVar58;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar124 [12];
  undefined1 auVar125 [16];
  
  local_130.c = bottom_blob->c;
  local_130.elempack = bottom_blob->elempack;
  local_130.elemsize = bottom_blob->elemsize;
  pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  p_Var24 = pp_Var22[-3];
  iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var24);
  iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var24);
  iVar31 = *(int *)(&this->field_0xdc + (long)p_Var24);
  iVar25 = *(int *)(&this->field_0xe0 + (long)p_Var24);
  local_130.data = bottom_blob->data;
  local_130.refcount = bottom_blob->refcount;
  local_130.allocator = bottom_blob->allocator;
  local_130.dims = bottom_blob->dims;
  local_130.w = bottom_blob->w;
  local_130.h = bottom_blob->h;
  local_130.d = bottom_blob->d;
  local_130.cstep = bottom_blob->cstep;
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    *local_130.refcount = *local_130.refcount + 1;
    UNLOCK();
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  }
  if (local_130.elempack == 0 || ((int)local_130.elemsize * 8) / local_130.elempack != 8) {
    uVar39 = (long)(local_130.elempack * local_130.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var22[-3]);
    local_238.cstep = 0;
    local_238.data = (undefined4 *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    Mat::create(&local_238,local_130.elempack * local_130.c,4,(Allocator *)0x0);
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
    p_Var24 = pp_Var22[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
      lVar36 = 0;
      puVar26 = (undefined4 *)local_238.data;
      do {
        if (0 < (int)uVar39) {
          uVar5 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var24) + lVar36 * 4);
          uVar40 = uVar39 & 0xffffffff;
          do {
            *puVar26 = uVar5;
            puVar26 = puVar26 + 1;
            uVar30 = (int)uVar40 - 1;
            uVar40 = (ulong)uVar30;
          } while (uVar30 != 0);
          p_Var24 = pp_Var22[-3];
        }
        lVar36 = lVar36 + 1;
      } while (lVar36 < *(int *)(&this->field_0x108 + (long)p_Var24));
    }
    local_2f8._0_8_ = *(undefined8 *)opt;
    local_2f8._16_8_ = opt->workspace_allocator;
    local_2f8._24_4_ = opt->openmp_blocktime;
    local_2f8[0x1c] = opt->use_winograd_convolution;
    local_2f8[0x1d] = opt->use_sgemm_convolution;
    local_2f8[0x1e] = opt->use_int8_inference;
    local_2f8[0x1f] = opt->use_vulkan_compute;
    local_2f8._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    local_2f8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_2f8._48_4_ = opt->flush_denormals;
    unique0x00006c84 = opt->use_local_pool_allocator;
    unique0x00006c85 = opt->use_shader_local_memory;
    unique0x00006c86 = opt->use_cooperative_matrix;
    unique0x00006c87 = opt->use_winograd23_convolution;
    unique0x00006c88 = opt->use_winograd43_convolution;
    unique0x00006c89 = opt->use_winograd63_convolution;
    unique0x00006c8a = opt->use_a53_a55_optimized_kernel;
    unique0x00006c8b = opt->use_reserved_7;
    unique0x00006c8c = opt->use_reserved_8;
    unique0x00006c8d = opt->use_reserved_9;
    unique0x00006c8e = opt->use_reserved_10;
    unique0x00006c8f = opt->use_reserved_11;
    local_2f8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_130,&local_238,(Option *)local_2f8);
    piVar9 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_238.data != (undefined4 *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  }
  local_238.cstep = 0;
  local_238.data = (pointer)0x0;
  local_238.refcount._0_4_ = 0;
  local_238.refcount._4_4_ = 0;
  local_238.elemsize._0_4_ = 0;
  local_238.elemsize._4_4_ = 0;
  local_238.elempack = 0;
  local_238.allocator = (Allocator *)0x0;
  local_238.dims = 0;
  local_238.w = 0;
  local_238.h = 0;
  local_238.d = 0;
  local_238.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)pp_Var22[-3]),&local_130,
             &local_238,opt);
  iVar35 = local_238.w;
  iVar28 = local_238.elempack;
  iVar27 = -100;
  if (((pointer)local_238.data == (pointer)0x0) || (local_238.cstep * (long)local_238.c == 0))
  goto LAB_003d0791;
  p_Var24 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar29 = (~((iVar29 + -1) * iVar31) + local_238.w) / *(int *)(&this->field_0xe4 + (long)p_Var24);
  iVar31 = iVar29 + 1;
  uVar39 = (long)(~((iVar37 + -1) * iVar25) + local_238.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var24);
  local_248 = uVar39 & 0xffffffff;
  iVar37 = (int)uVar39 + 1;
  uVar30 = local_238.elempack * local_238.c;
  if ((uVar30 == *(uint *)(&this->field_0x108 + (long)p_Var24)) &&
     (uVar30 == *(uint *)(&this->field_0xd0 + (long)p_Var24))) {
    uVar21 = 8;
    if (opt->use_packing_layout == false) {
      uVar21 = 1;
    }
    if ((uVar30 & 7) != 0) {
      uVar21 = 1;
    }
    opt_00 = (Option *)(ulong)uVar21;
    iVar25 = *(int *)(&this->field_0x10c + (long)p_Var24);
    _elemsize = (Option *)(ulong)(uVar21 * 4);
    if (100 < iVar25) {
      _elemsize = opt_00;
    }
    local_240 = (pointer)(long)local_238.c;
    Mat::create(top_blob,iVar31,iVar37,(int)uVar30 / (int)uVar21,(size_t)_elemsize,uVar21,
                opt->blob_allocator);
    iVar27 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_003d0791;
    iVar27 = 0;
    if (iVar28 == 1) {
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var24 = pp_Var22[-3];
      iVar37 = *(int *)(&this->field_0xd8 + (long)p_Var24);
      if (iVar37 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var24) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var24) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var24) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var24) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var24) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var24) < 2)))) {
          if (iVar25 < 0x65) {
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (Allocator *)0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar36 = 0;
              do {
                fVar32 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) +
                                          lVar36 * 4) *
                               *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24) + lVar36 * 4
                                         ));
                local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar32);
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_298);
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar32;
                  local_2f8._8_8_ = local_2f8._8_8_ + 4;
                }
                lVar36 = lVar36 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86[-3];
              } while (lVar36 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s1_int8_dequant_sse
                      (&local_238,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (Allocator *)0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar36 = 0;
              do {
                fVar32 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + lVar36 * 4);
                fVar59 = 0.0;
                if (fVar32 != 0.0) {
                  fVar59 = 1.0 / (fVar32 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24)
                                                     + lVar36 * 4));
                }
                local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar59);
                local_1d8 = (pointer)CONCAT44(local_1d8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(&this->field_0x288 + (long)p_Var24) +
                                               lVar36 * 4));
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_298);
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar59;
                  local_2f8._8_8_ = local_2f8._8_8_ + 4;
                }
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_1d8);
                }
                else {
                  *(float *)local_2f8._8_8_ = local_1d8._0_4_;
                  local_2f8._8_8_ = local_2f8._8_8_ + 4;
                }
                lVar36 = lVar36 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86[-3];
              } while (lVar36 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s1_int8_requant_sse
                      (&local_238,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          iVar37 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var24) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var24) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var24) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var24) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var24))) goto LAB_003d0229;
          if (iVar25 < 0x65) {
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (Allocator *)0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar36 = 0;
              do {
                fVar32 = 1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) +
                                          lVar36 * 4) *
                               *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24) + lVar36 * 4
                                         ));
                local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar32);
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_298);
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar32;
                  local_2f8._8_8_ = local_2f8._8_8_ + 4;
                }
                lVar36 = lVar36 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86[-3];
              } while (lVar36 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_d8,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s2_int8_dequant_sse
                      (&local_238,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_d8,opt_00);
          }
          else {
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_8_ = (Allocator *)0x0;
            local_2f8._16_8_ = (Allocator *)0x0;
            p_Var24 = pp_Var22[-3];
            if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
              lVar36 = 0;
              do {
                fVar32 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + lVar36 * 4);
                fVar59 = 0.0;
                if (fVar32 != 0.0) {
                  fVar59 = 1.0 / (fVar32 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var24)
                                                     + lVar36 * 4));
                }
                local_298.data = (void *)CONCAT44(local_298.data._4_4_,fVar59);
                local_1d8 = (pointer)CONCAT44(local_1d8._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(&this->field_0x288 + (long)p_Var24) +
                                               lVar36 * 4));
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_298);
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar59;
                  local_2f8._8_8_ = local_2f8._8_8_ + 4;
                }
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_1d8);
                }
                else {
                  *(float *)local_2f8._8_8_ = local_1d8._0_4_;
                  local_2f8._8_8_ = local_2f8._8_8_ + 4;
                }
                lVar36 = lVar36 + 1;
                p_Var24 = this->_vptr_ConvolutionDepthWise_x86[-3];
              } while (lVar36 < *(int *)(&this->field_0x108 + (long)p_Var24));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_c0,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s2_int8_requant_sse
                      (&local_238,top_blob,(Mat *)(this->weight_data_tm).data,
                       *(Mat **)(&this->field_0x1b0 + (long)p_Var24),&local_c0,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
        }
        pLVar10 = this->activation;
        if (pLVar10 != (Layer *)0x0) {
          (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
          iVar27 = 0;
          goto LAB_003d0791;
        }
      }
      else {
LAB_003d0229:
        uVar30 = iVar37 * *(int *)(&this->field_0xd4 + (long)p_Var24);
        local_188 = (size_type)(int)uVar30;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2f8,local_188,
                   (allocator_type *)&local_298);
        uVar19 = local_2f8._0_8_;
        pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
        p_Var24 = pp_Var22[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var24)) {
          iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var24);
          iVar31 = *(int *)(&this->field_0xdc + (long)p_Var24);
          iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var24);
          iVar27 = 0;
          fVar32 = 0.0;
          iVar33 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var24)) {
              lVar36 = 0;
              do {
                *(float *)(local_2f8._0_8_ + (iVar33 + lVar36) * 4) = fVar32;
                p_Var24 = pp_Var22[-3];
                fVar32 = (float)((int)fVar32 + *(int *)(&this->field_0xdc + (long)p_Var24));
                lVar36 = lVar36 + 1;
              } while ((int)lVar36 < *(int *)(&this->field_0xd4 + (long)p_Var24));
              iVar33 = iVar33 + (int)lVar36;
            }
            fVar32 = (float)((int)fVar32 + (iVar35 * iVar37 - iVar31 * iVar28));
            iVar27 = iVar27 + 1;
          } while (iVar27 < *(int *)(&this->field_0xd8 + (long)p_Var24));
        }
        if (0 < *(int *)(&this->field_0x108 + (long)p_Var24)) {
          lVar36 = 0;
          lVar41 = 0;
          local_190 = pp_Var22;
          do {
            if (-1 < (int)local_248) {
              local_240 = (pointer)(local_238.cstep * lVar41 *
                                    CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize
                                            ) + (long)local_238.data);
              local_308 = (float *)(top_blob->elemsize * lVar41 * top_blob->cstep +
                                   (long)top_blob->data);
              local_2a8 = this->_vptr_ConvolutionDepthWise_x86;
              local_1e0 = (long)local_238.w *
                          CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
              pvVar8 = (this->weight_data_tm).data;
              local_1e8 = 0;
              local_300 = local_308;
              local_180 = lVar36;
              do {
                if (-1 < iVar29) {
                  local_2a0 = (pointer)(long)(int)local_1e8;
                  iVar37 = 0;
                  do {
                    p_Var24 = local_2a8[-3];
                    fVar59 = 0.0;
                    fVar32 = 0.0;
                    if (0 < (int)uVar30) {
                      uVar39 = 0;
                      iVar31 = 0;
                      do {
                        iVar31 = iVar31 + (int)*(char *)((long)pvVar8 + uVar39 + lVar36) *
                                          (int)*(char *)((long)local_240 +
                                                        (long)(int)*(pointer)(uVar19 + uVar39 * 4) +
                                                        (long)*(int *)(&this->field_0xe8 +
                                                                      (long)p_Var24) *
                                                        (long)local_2a0 * local_1e0 +
                                                        (long)iVar37 *
                                                        (long)*(int *)(&this->field_0xe4 +
                                                                      (long)p_Var24));
                        uVar39 = uVar39 + 1;
                      } while (uVar30 != uVar39);
                      fVar32 = (float)iVar31;
                    }
                    fVar60 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + lVar41 * 4);
                    if (fVar60 != 0.0) {
                      fVar59 = 1.0 / (fVar60 * *(float *)(*(long *)(&this->field_0x240 +
                                                                   (long)p_Var24) + lVar41 * 4));
                    }
                    fVar59 = fVar59 * fVar32;
                    if (*(int *)(&this->field_0x100 + (long)p_Var24) != 0) {
                      fVar59 = fVar59 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var24) +
                                                  lVar41 * 4);
                    }
                    fVar32 = fVar59;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var24)) {
                    case 1:
                      if (fVar59 <= 0.0) {
                        fVar32 = 0.0;
                      }
                      break;
                    case 2:
                      fVar32 = (float)(-(uint)(0.0 < fVar59) & 0x3f800000 |
                                      ~-(uint)(0.0 < fVar59) &
                                      **(uint **)(&this->field_0x118 + (long)p_Var24)) * fVar59;
                      break;
                    case 3:
                      fVar32 = **(float **)(&this->field_0x118 + (long)p_Var24);
                      if (fVar59 <= fVar32) {
                        fVar59 = fVar32;
                      }
                      fVar32 = (*(float **)(&this->field_0x118 + (long)p_Var24))[1];
                      if (fVar59 <= fVar32) {
                        fVar32 = fVar59;
                      }
                      break;
                    case 4:
                      if (88.37626 <= fVar59) {
                        fVar59 = 88.37626;
                      }
                      fVar32 = expf((float)(-(uint)(fVar59 < -88.37626) & 0x42b0c0a5 |
                                           ~-(uint)(fVar59 < -88.37626) & (uint)-fVar59));
                      fVar32 = 1.0 / (fVar32 + 1.0);
                      break;
                    case 5:
                      uStack_e4 = 0;
                      uStack_e0 = 0;
                      uStack_dc = 0;
                      local_e8 = fVar59;
                      fVar32 = expf(fVar59);
                      fVar32 = logf(fVar32 + 1.0);
                      fVar32 = tanhf(fVar32);
                      fVar32 = fVar32 * local_e8;
                      break;
                    case 6:
                      fVar60 = **(float **)(&this->field_0x118 + (long)p_Var24);
                      fVar61 = (*(float **)(&this->field_0x118 + (long)p_Var24))[1];
                      fVar63 = -fVar61 / fVar60;
                      fVar32 = 0.0;
                      if ((fVar63 <= fVar59) && (fVar32 = fVar59, fVar59 <= fVar63 + 1.0 / fVar60))
                      {
                        fVar32 = (fVar60 * fVar59 + fVar61) * fVar59;
                      }
                    }
                    if (iVar25 < 0x65) {
                      *local_300 = fVar32;
                      local_300 = local_300 + 1;
                    }
                    else {
                      fVar32 = roundf(fVar32 * *(float *)(*(long *)(&this->field_0x288 +
                                                                   (long)p_Var24) + lVar41 * 4));
                      iVar31 = (int)fVar32;
                      if (iVar31 < -0x7e) {
                        iVar31 = -0x7f;
                      }
                      uVar20 = (undefined1)iVar31;
                      if (0x7e < iVar31) {
                        uVar20 = 0x7f;
                      }
                      *(undefined1 *)local_308 = uVar20;
                      local_308 = (float *)((long)local_308 + 1);
                    }
                    bVar42 = iVar37 != iVar29;
                    iVar37 = iVar37 + 1;
                  } while (bVar42);
                }
                iVar37 = (int)local_1e8;
                local_1e8 = (ulong)(iVar37 + 1);
              } while (iVar37 != (int)local_248);
              p_Var24 = local_190[-3];
              lVar36 = local_180;
            }
            lVar41 = lVar41 + 1;
            lVar36 = lVar36 + local_188;
          } while (lVar41 < *(int *)(&this->field_0x108 + (long)p_Var24));
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          uVar39 = local_2f8._16_8_ - local_2f8._0_8_;
          goto LAB_003d06a8;
        }
      }
    }
    else {
      if (iVar28 != 8) goto LAB_003d0791;
      uVar39 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) *
               (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2f8,uVar39,(allocator_type *)&local_298)
      ;
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var24 = pp_Var22[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var24)) {
        iVar37 = *(int *)(&this->field_0xe0 + (long)p_Var24);
        iVar31 = *(int *)(&this->field_0xdc + (long)p_Var24);
        iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var24);
        iVar27 = 0;
        fVar32 = 0.0;
        iVar33 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var24)) {
            lVar36 = 0;
            do {
              *(float *)(local_2f8._0_8_ + (iVar27 + lVar36) * 4) = fVar32;
              p_Var24 = pp_Var22[-3];
              fVar32 = (float)((int)fVar32 + *(int *)(&this->field_0xdc + (long)p_Var24));
              lVar36 = lVar36 + 1;
            } while ((int)lVar36 < *(int *)(&this->field_0xd4 + (long)p_Var24));
            iVar27 = iVar27 + (int)lVar36;
          }
          fVar32 = (float)((int)fVar32 + (iVar35 * iVar37 - iVar31 * iVar28));
          iVar33 = iVar33 + 1;
        } while (iVar33 < *(int *)(&this->field_0xd8 + (long)p_Var24));
      }
      auVar18 = _DAT_00557da0;
      if (0 < (int)local_240) {
        iVar31 = (int)uVar39 * 8;
        local_1e0 = CONCAT44(local_1e0._4_4_,iVar31);
        iVar37 = 0;
        fVar32 = (float)DAT_00557da0;
        fVar59 = DAT_00557da0._4_4_;
        fVar60 = DAT_00557da0._8_4_;
        fVar61 = DAT_00557da0._12_4_;
        local_2a0 = (pointer)0x0;
        do {
          if (-1 < (int)local_248) {
            pauVar34 = (undefined1 (*) [16])
                       (top_blob->elemsize * (long)local_2a0 * top_blob->cstep +
                       (long)top_blob->data);
            pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
            pvVar8 = (this->weight_data_tm).data;
            pp_Var23 = (_func_int **)0x0;
            pauVar38 = pauVar34;
            do {
              local_2a8 = pp_Var23;
              iVar28 = (int)local_2a8;
              if (-1 < iVar29) {
                iVar35 = 0;
                do {
                  p_Var24 = pp_Var22[-3];
                  if ((int)uVar39 < 1) {
                    auVar113 = ZEXT816(0);
                    auVar71 = ZEXT816(0);
                  }
                  else {
                    iVar27 = 0;
                    iVar33 = 0;
                    iVar53 = 0;
                    iVar56 = 0;
                    uVar40 = 0;
                    iVar62 = 0;
                    iVar74 = 0;
                    iVar76 = 0;
                    iVar78 = 0;
                    do {
                      uVar7 = *(ulong *)((long)local_238.data +
                                        (long)(int)*(pointer)(local_2f8._0_8_ + uVar40 * 4) * 8 +
                                        (long)*(int *)(&this->field_0xe8 + (long)p_Var24) *
                                        (long)iVar28 *
                                        (long)local_238.w *
                                        CONCAT44(local_238.elemsize._4_4_,
                                                 (undefined4)local_238.elemsize) +
                                        (long)(*(int *)(&this->field_0xe4 + (long)p_Var24) * iVar35
                                              * 8) +
                                        local_238.cstep * (long)local_2a0 *
                                        CONCAT44(local_238.elemsize._4_4_,
                                                 (undefined4)local_238.elemsize));
                      cVar92 = (char)(uVar7 >> 8);
                      cVar93 = (char)(uVar7 >> 0x10);
                      cVar94 = (char)(uVar7 >> 0x18);
                      cVar95 = (char)(uVar7 >> 0x20);
                      cVar98 = (char)(uVar7 >> 0x28);
                      cVar99 = (char)(uVar7 >> 0x30);
                      auVar87._8_6_ = 0;
                      auVar87._0_8_ = uVar7;
                      auVar87[0xe] = (char)(uVar7 >> 0x38);
                      auVar87[0xf] = -((long)uVar7 < 0);
                      auVar86._14_2_ = auVar87._14_2_;
                      auVar86._8_5_ = 0;
                      auVar86._0_8_ = uVar7;
                      auVar86[0xd] = -(cVar99 < '\0');
                      auVar85._13_3_ = auVar86._13_3_;
                      auVar85._8_4_ = 0;
                      auVar85._0_8_ = uVar7;
                      auVar85[0xc] = cVar99;
                      auVar84._12_4_ = auVar85._12_4_;
                      auVar84._8_3_ = 0;
                      auVar84._0_8_ = uVar7;
                      auVar84[0xb] = -(cVar98 < '\0');
                      auVar83._11_5_ = auVar84._11_5_;
                      auVar83._8_2_ = 0;
                      auVar83._0_8_ = uVar7;
                      auVar83[10] = cVar98;
                      auVar82._10_6_ = auVar83._10_6_;
                      auVar82[8] = 0;
                      auVar82._0_8_ = uVar7;
                      auVar82[9] = -(cVar95 < '\0');
                      auVar115._9_7_ = auVar82._9_7_;
                      auVar115[8] = cVar95;
                      auVar115._0_8_ = uVar7;
                      Var13 = CONCAT91(CONCAT81(auVar115._8_8_,-(cVar94 < '\0')),cVar94);
                      auVar12._2_10_ = Var13;
                      auVar12[1] = -(cVar93 < '\0');
                      auVar12[0] = cVar93;
                      auVar11._2_12_ = auVar12;
                      auVar11[1] = -(cVar92 < '\0');
                      auVar11[0] = cVar92;
                      auVar130._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar130._2_14_ = auVar11;
                      uVar7 = *(ulong *)((long)pvVar8 + uVar40 * 8 + (long)iVar37);
                      cVar92 = (char)(uVar7 >> 8);
                      cVar93 = (char)(uVar7 >> 0x10);
                      cVar94 = (char)(uVar7 >> 0x18);
                      cVar95 = (char)(uVar7 >> 0x20);
                      cVar98 = (char)(uVar7 >> 0x28);
                      cVar99 = (char)(uVar7 >> 0x30);
                      auVar112._8_6_ = 0;
                      auVar112._0_8_ = uVar7;
                      auVar112[0xe] = (char)(uVar7 >> 0x38);
                      auVar112[0xf] = -((long)uVar7 < 0);
                      auVar111._14_2_ = auVar112._14_2_;
                      auVar111._8_5_ = 0;
                      auVar111._0_8_ = uVar7;
                      auVar111[0xd] = -(cVar99 < '\0');
                      auVar110._13_3_ = auVar111._13_3_;
                      auVar110._8_4_ = 0;
                      auVar110._0_8_ = uVar7;
                      auVar110[0xc] = cVar99;
                      auVar109._12_4_ = auVar110._12_4_;
                      auVar109._8_3_ = 0;
                      auVar109._0_8_ = uVar7;
                      auVar109[0xb] = -(cVar98 < '\0');
                      auVar108._11_5_ = auVar109._11_5_;
                      auVar108._8_2_ = 0;
                      auVar108._0_8_ = uVar7;
                      auVar108[10] = cVar98;
                      auVar107._10_6_ = auVar108._10_6_;
                      auVar107[8] = 0;
                      auVar107._0_8_ = uVar7;
                      auVar107[9] = -(cVar95 < '\0');
                      auVar106._9_7_ = auVar107._9_7_;
                      auVar106[8] = cVar95;
                      auVar106._0_8_ = uVar7;
                      Var16 = CONCAT91(CONCAT81(auVar106._8_8_,-(cVar94 < '\0')),cVar94);
                      auVar15._2_10_ = Var16;
                      auVar15[1] = -(cVar93 < '\0');
                      auVar15[0] = cVar93;
                      auVar14._2_12_ = auVar15;
                      auVar14[1] = -(cVar92 < '\0');
                      auVar14[0] = cVar92;
                      auVar105._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar105._2_14_ = auVar14;
                      sVar128 = (short)Var16 * (short)Var13;
                      auVar113 = pmulhw(auVar105,auVar130);
                      iVar123 = CONCAT22(auVar113._6_2_,sVar128);
                      Var13 = CONCAT64(CONCAT42(iVar123,auVar113._4_2_),
                                       CONCAT22(auVar15._0_2_ * auVar12._0_2_,sVar128));
                      auVar17._4_8_ = (long)((unkuint10)Var13 >> 0x10);
                      auVar17._2_2_ = auVar113._2_2_;
                      auVar17._0_2_ = auVar14._0_2_ * auVar11._0_2_;
                      iVar27 = iVar27 + CONCAT22(auVar113._0_2_,auVar105._0_2_ * auVar130._0_2_);
                      iVar33 = iVar33 + auVar17._0_4_;
                      iVar53 = iVar53 + (int)((unkuint10)Var13 >> 0x10);
                      iVar56 = iVar56 + iVar123;
                      iVar123 = CONCAT22(auVar113._8_2_,auVar106._8_2_ * auVar115._8_2_);
                      auVar124._0_8_ =
                           CONCAT26(auVar113._10_2_,
                                    CONCAT24(auVar108._10_2_ * auVar83._10_2_,iVar123));
                      auVar124._8_2_ = auVar110._12_2_ * auVar85._12_2_;
                      auVar124._10_2_ = auVar113._12_2_;
                      auVar125._12_2_ = auVar111._14_2_ * auVar86._14_2_;
                      auVar125._0_12_ = auVar124;
                      auVar125._14_2_ = auVar113._14_2_;
                      iVar62 = iVar62 + iVar123;
                      iVar74 = iVar74 + (int)((ulong)auVar124._0_8_ >> 0x20);
                      iVar76 = iVar76 + auVar124._8_4_;
                      iVar78 = iVar78 + auVar125._12_4_;
                      uVar40 = uVar40 + 1;
                    } while ((uVar39 & 0xffffffff) != uVar40);
                    auVar71._0_4_ = (float)iVar27;
                    auVar71._4_4_ = (float)iVar33;
                    auVar71._8_4_ = (float)iVar53;
                    auVar71._12_4_ = (float)iVar56;
                    auVar113._0_4_ = (float)iVar62;
                    auVar113._4_4_ = (float)iVar74;
                    auVar113._8_4_ = (float)iVar76;
                    auVar113._12_4_ = (float)iVar78;
                  }
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var24) +
                                    (long)local_2a0 * 0x20);
                  pfVar3 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var24) + 0x10 +
                                    (long)local_2a0 * 0x20);
                  pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) +
                                    (long)local_2a0 * 0x20);
                  pfVar4 = (float *)(*(long *)(&this->field_0x1f8 + (long)p_Var24) + 0x10 +
                                    (long)local_2a0 * 0x20);
                  auVar114._0_4_ = *pfVar1 * *pfVar2;
                  auVar114._4_4_ = pfVar1[1] * pfVar2[1];
                  auVar114._8_4_ = pfVar1[2] * pfVar2[2];
                  auVar114._12_4_ = pfVar1[3] * pfVar2[3];
                  auVar115 = rcpps(auVar114,auVar114);
                  auVar129._0_4_ = *pfVar3 * *pfVar4;
                  auVar129._4_4_ = pfVar3[1] * pfVar4[1];
                  auVar129._8_4_ = pfVar3[2] * pfVar4[2];
                  auVar129._12_4_ = pfVar3[3] * pfVar4[3];
                  auVar130 = rcpps(auVar129,auVar129);
                  auVar43._0_12_ = ZEXT812(0);
                  auVar43._12_4_ = 0;
                  auVar45._0_4_ = (float)(-(uint)(*pfVar2 != 0.0) & auVar115._0_4_) * auVar71._0_4_;
                  auVar45._4_4_ =
                       (float)(-(uint)(pfVar2[1] != 0.0) & auVar115._4_4_) * auVar71._4_4_;
                  auVar45._8_4_ =
                       (float)(-(uint)(pfVar2[2] != 0.0) & auVar115._8_4_) * auVar71._8_4_;
                  auVar45._12_4_ =
                       (float)(-(uint)(pfVar2[3] != 0.0) & auVar115._12_4_) * auVar71._12_4_;
                  auVar126._0_4_ =
                       (float)(-(uint)(*pfVar4 != 0.0) & auVar130._0_4_) * auVar113._0_4_;
                  auVar126._4_4_ =
                       (float)(-(uint)(pfVar4[1] != 0.0) & auVar130._4_4_) * auVar113._4_4_;
                  auVar126._8_4_ =
                       (float)(-(uint)(pfVar4[2] != 0.0) & auVar130._8_4_) * auVar113._8_4_;
                  auVar126._12_4_ =
                       (float)(-(uint)(pfVar4[3] != 0.0) & auVar130._12_4_) * auVar113._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var24) != 0) {
                    auVar113 = *(undefined1 (*) [16])
                                (*(long *)(&this->field_0x1b0 + (long)p_Var24) +
                                (long)local_2a0 * 0x20);
                    auVar71 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1b0 + (long)p_Var24) + 0x10 +
                               (long)local_2a0 * 0x20);
                    auVar45._0_4_ = auVar45._0_4_ + auVar113._0_4_;
                    auVar45._4_4_ = auVar45._4_4_ + auVar113._4_4_;
                    auVar45._8_4_ = auVar45._8_4_ + auVar113._8_4_;
                    auVar45._12_4_ = auVar45._12_4_ + auVar113._12_4_;
                    auVar126._0_4_ = auVar126._0_4_ + auVar71._0_4_;
                    auVar126._4_4_ = auVar126._4_4_ + auVar71._4_4_;
                    auVar126._8_4_ = auVar126._8_4_ + auVar71._8_4_;
                    auVar126._12_4_ = auVar126._12_4_ + auVar71._12_4_;
                  }
                  fVar63 = auVar45._0_4_;
                  fVar75 = auVar45._4_4_;
                  fVar77 = auVar45._8_4_;
                  fVar79 = auVar45._12_4_;
                  fVar81 = auVar126._0_4_;
                  fVar97 = auVar126._4_4_;
                  fVar101 = auVar126._8_4_;
                  fVar103 = auVar126._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var24)) {
                  case 1:
                    auVar45 = maxps(auVar45,auVar43);
                    auVar126 = maxps(auVar126,auVar43);
                    break;
                  case 2:
                    auVar71 = maxps(auVar45,auVar43);
                    auVar113 = minps(auVar45,auVar43);
                    fVar63 = **(float **)(&this->field_0x118 + (long)p_Var24);
                    auVar45._0_4_ = auVar113._0_4_ * fVar63 + auVar71._0_4_;
                    auVar45._4_4_ = auVar113._4_4_ * fVar63 + auVar71._4_4_;
                    auVar45._8_4_ = auVar113._8_4_ * fVar63 + auVar71._8_4_;
                    auVar45._12_4_ = auVar113._12_4_ * fVar63 + auVar71._12_4_;
                    auVar113 = maxps(auVar126,auVar43);
                    auVar71 = minps(auVar126,auVar43);
                    auVar126._0_4_ = auVar71._0_4_ * fVar63 + auVar113._0_4_;
                    auVar126._4_4_ = auVar71._4_4_ * fVar63 + auVar113._4_4_;
                    auVar126._8_4_ = auVar71._8_4_ * fVar63 + auVar113._8_4_;
                    auVar126._12_4_ = auVar71._12_4_ * fVar63 + auVar113._12_4_;
                    break;
                  case 3:
                    uVar5 = **(undefined4 **)(&this->field_0x118 + (long)p_Var24);
                    uVar6 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var24))[1];
                    auVar68._4_4_ = uVar5;
                    auVar68._0_4_ = uVar5;
                    auVar68._8_4_ = uVar5;
                    auVar68._12_4_ = uVar5;
                    auVar89._4_4_ = uVar6;
                    auVar89._0_4_ = uVar6;
                    auVar89._8_4_ = uVar6;
                    auVar89._12_4_ = uVar6;
                    auVar113 = maxps(auVar45,auVar68);
                    auVar45 = minps(auVar113,auVar89);
                    auVar113 = maxps(auVar126,auVar68);
                    auVar126 = minps(auVar113,auVar89);
                    break;
                  case 4:
                    auVar46._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
                    auVar46._8_4_ = -fVar77;
                    auVar46._12_4_ = -fVar79;
                    auVar113 = minps(auVar46,_DAT_00557d60);
                    auVar113 = maxps(auVar113,_DAT_00557d70);
                    fVar63 = auVar113._0_4_ * 1.442695 + 0.5;
                    fVar75 = auVar113._4_4_ * 1.442695 + 0.5;
                    fVar77 = auVar113._8_4_ * 1.442695 + 0.5;
                    fVar79 = auVar113._12_4_ * 1.442695 + 0.5;
                    fVar81 = (float)(int)fVar63;
                    fVar97 = (float)(int)fVar75;
                    fVar104 = (float)(int)fVar77;
                    fVar120 = (float)(int)fVar79;
                    fVar81 = fVar81 - (float)(-(uint)(fVar63 < fVar81) & (uint)fVar32);
                    fVar97 = fVar97 - (float)(-(uint)(fVar75 < fVar97) & (uint)fVar59);
                    fVar104 = fVar104 - (float)(-(uint)(fVar77 < fVar104) & (uint)fVar60);
                    fVar120 = fVar120 - (float)(-(uint)(fVar79 < fVar120) & (uint)fVar61);
                    fVar63 = auVar113._0_4_ - fVar81 * 0.6931472;
                    fVar75 = auVar113._4_4_ - fVar97 * 0.6931472;
                    fVar77 = auVar113._8_4_ - fVar104 * 0.6931472;
                    fVar79 = auVar113._12_4_ - fVar120 * 0.6931472;
                    auVar69._0_4_ = fVar63 * fVar63;
                    auVar69._4_4_ = fVar75 * fVar75;
                    auVar69._8_4_ = fVar77 * fVar77;
                    auVar69._12_4_ = fVar79 * fVar79;
                    auVar90._0_4_ =
                         (float)((int)fVar81 * 0x800000 + (int)fVar32) *
                         (fVar63 + fVar32 +
                         (((((fVar63 * (float)DAT_00557dc0 + 0.0013981999) * fVar63 + 0.008333452) *
                            fVar63 + 0.041665796) * fVar63 + (float)DAT_00557e00) * fVar63 + 0.5) *
                         auVar69._0_4_) + fVar32;
                    auVar90._4_4_ =
                         (float)((int)fVar97 * 0x800000 + (int)fVar59) *
                         (fVar75 + fVar59 +
                         (((((fVar75 * DAT_00557dc0._4_4_ + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + DAT_00557e00._4_4_) * fVar75 + 0.5) *
                         auVar69._4_4_) + fVar59;
                    auVar90._8_4_ =
                         (float)((int)fVar104 * 0x800000 + (int)fVar60) *
                         (fVar77 + fVar60 +
                         (((((fVar77 * DAT_00557dc0._8_4_ + 0.0013981999) * fVar77 + 0.008333452) *
                            fVar77 + 0.041665796) * fVar77 + DAT_00557e00._8_4_) * fVar77 + 0.5) *
                         auVar69._8_4_) + fVar60;
                    auVar90._12_4_ =
                         (float)((int)fVar120 * 0x800000 + (int)fVar61) *
                         (fVar79 + fVar61 +
                         (((((fVar79 * DAT_00557dc0._12_4_ + 0.0013981999) * fVar79 + 0.008333452) *
                            fVar79 + 0.041665796) * fVar79 + DAT_00557e00._12_4_) * fVar79 + 0.5) *
                         auVar69._12_4_) + fVar61;
                    auVar113 = rcpps(auVar69,auVar90);
                    fVar63 = auVar113._0_4_;
                    fVar75 = auVar113._4_4_;
                    fVar77 = auVar113._8_4_;
                    fVar79 = auVar113._12_4_;
                    auVar45._0_4_ = (fVar32 - auVar90._0_4_ * fVar63) * fVar63 + fVar63;
                    auVar45._4_4_ = (fVar59 - auVar90._4_4_ * fVar75) * fVar75 + fVar75;
                    auVar45._8_4_ = (fVar60 - auVar90._8_4_ * fVar77) * fVar77 + fVar77;
                    auVar45._12_4_ = (fVar61 - auVar90._12_4_ * fVar79) * fVar79 + fVar79;
                    auVar127._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                    auVar127._8_4_ = -fVar101;
                    auVar127._12_4_ = -fVar103;
                    auVar113 = minps(auVar127,_DAT_00557d60);
                    auVar113 = maxps(auVar113,_DAT_00557d70);
                    fVar81 = auVar113._0_4_ * 1.442695 + 0.5;
                    fVar97 = auVar113._4_4_ * 1.442695 + 0.5;
                    fVar101 = auVar113._8_4_ * 1.442695 + 0.5;
                    fVar103 = auVar113._12_4_ * 1.442695 + 0.5;
                    fVar63 = (float)(int)fVar81;
                    fVar75 = (float)(int)fVar97;
                    fVar77 = (float)(int)fVar101;
                    fVar79 = (float)(int)fVar103;
                    fVar63 = fVar63 - (float)(-(uint)(fVar81 < fVar63) & (uint)fVar32);
                    fVar75 = fVar75 - (float)(-(uint)(fVar97 < fVar75) & (uint)fVar59);
                    fVar77 = fVar77 - (float)(-(uint)(fVar101 < fVar77) & (uint)fVar60);
                    fVar79 = fVar79 - (float)(-(uint)(fVar103 < fVar79) & (uint)fVar61);
                    fVar81 = auVar113._0_4_ - fVar63 * 0.6931472;
                    fVar97 = auVar113._4_4_ - fVar75 * 0.6931472;
                    fVar101 = auVar113._8_4_ - fVar77 * 0.6931472;
                    fVar103 = auVar113._12_4_ - fVar79 * 0.6931472;
                    auVar91._0_4_ = fVar81 * fVar81;
                    auVar91._4_4_ = fVar97 * fVar97;
                    auVar91._8_4_ = fVar101 * fVar101;
                    auVar91._12_4_ = fVar103 * fVar103;
                    auVar70._0_4_ =
                         (float)((int)fVar63 * 0x800000 + (int)fVar32) *
                         (fVar81 + fVar32 +
                         (((((fVar81 * (float)DAT_00557dc0 + 0.0013981999) * fVar81 + 0.008333452) *
                            fVar81 + 0.041665796) * fVar81 + (float)DAT_00557e00) * fVar81 + 0.5) *
                         auVar91._0_4_) + fVar32;
                    auVar70._4_4_ =
                         (float)((int)fVar75 * 0x800000 + (int)fVar59) *
                         (fVar97 + fVar59 +
                         (((((fVar97 * DAT_00557dc0._4_4_ + 0.0013981999) * fVar97 + 0.008333452) *
                            fVar97 + 0.041665796) * fVar97 + DAT_00557e00._4_4_) * fVar97 + 0.5) *
                         auVar91._4_4_) + fVar59;
                    auVar70._8_4_ =
                         (float)((int)fVar77 * 0x800000 + (int)fVar60) *
                         (fVar101 + fVar60 +
                         (((((fVar101 * DAT_00557dc0._8_4_ + 0.0013981999) * fVar101 + 0.008333452)
                            * fVar101 + 0.041665796) * fVar101 + DAT_00557e00._8_4_) * fVar101 + 0.5
                         ) * auVar91._8_4_) + fVar60;
                    auVar70._12_4_ =
                         (float)((int)fVar79 * 0x800000 + (int)fVar61) *
                         (fVar103 + fVar61 +
                         (((((fVar103 * DAT_00557dc0._12_4_ + 0.0013981999) * fVar103 + 0.008333452)
                            * fVar103 + 0.041665796) * fVar103 + DAT_00557e00._12_4_) * fVar103 +
                         0.5) * auVar91._12_4_) + fVar61;
                    auVar113 = rcpps(auVar91,auVar70);
                    fVar63 = auVar113._0_4_;
                    fVar75 = auVar113._4_4_;
                    fVar77 = auVar113._8_4_;
                    fVar79 = auVar113._12_4_;
                    auVar126._0_4_ = (fVar32 - auVar70._0_4_ * fVar63) * fVar63 + fVar63;
                    auVar126._4_4_ = (fVar59 - auVar70._4_4_ * fVar75) * fVar75 + fVar75;
                    auVar126._8_4_ = (fVar60 - auVar70._8_4_ * fVar77) * fVar77 + fVar77;
                    auVar126._12_4_ = (fVar61 - auVar70._12_4_ * fVar79) * fVar79 + fVar79;
                    break;
                  case 5:
                    auVar113 = minps(auVar45,_DAT_00557d60);
                    auVar113 = maxps(auVar113,_DAT_00557d70);
                    fVar104 = auVar113._0_4_ * 1.442695 + 0.5;
                    fVar120 = auVar113._4_4_ * 1.442695 + 0.5;
                    fVar121 = auVar113._8_4_ * 1.442695 + 0.5;
                    fVar122 = auVar113._12_4_ * 1.442695 + 0.5;
                    fVar80 = (float)(int)fVar104;
                    fVar96 = (float)(int)fVar120;
                    fVar100 = (float)(int)fVar121;
                    fVar102 = (float)(int)fVar122;
                    fVar80 = fVar80 - (float)(-(uint)(fVar104 < fVar80) & (uint)fVar32);
                    fVar96 = fVar96 - (float)(-(uint)(fVar120 < fVar96) & (uint)fVar59);
                    fVar100 = fVar100 - (float)(-(uint)(fVar121 < fVar100) & (uint)fVar60);
                    fVar102 = fVar102 - (float)(-(uint)(fVar122 < fVar102) & (uint)fVar61);
                    fVar104 = auVar113._0_4_ - fVar80 * 0.6931472;
                    fVar120 = auVar113._4_4_ - fVar96 * 0.6931472;
                    fVar121 = auVar113._8_4_ - fVar100 * 0.6931472;
                    fVar122 = auVar113._12_4_ - fVar102 * 0.6931472;
                    auVar131._0_4_ =
                         (float)((int)fVar80 * 0x800000 + (int)fVar32) *
                         (fVar104 + fVar32 +
                         (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                            fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + 0.5) *
                         fVar104 * fVar104) + fVar32;
                    auVar131._4_4_ =
                         (float)((int)fVar96 * 0x800000 + (int)fVar59) *
                         (fVar120 + fVar59 +
                         (((((fVar120 * 0.00019875691 + 0.0013981999) * fVar120 + 0.008333452) *
                            fVar120 + 0.041665796) * fVar120 + 0.16666666) * fVar120 + 0.5) *
                         fVar120 * fVar120) + fVar59;
                    auVar131._8_4_ =
                         (float)((int)fVar100 * 0x800000 + (int)fVar60) *
                         (fVar121 + fVar60 +
                         (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) *
                            fVar121 + 0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5) *
                         fVar121 * fVar121) + fVar60;
                    auVar131._12_4_ =
                         (float)((int)fVar102 * 0x800000 + (int)fVar61) *
                         (fVar122 + fVar61 +
                         (((((fVar122 * 0.00019875691 + 0.0013981999) * fVar122 + 0.008333452) *
                            fVar122 + 0.041665796) * fVar122 + 0.16666666) * fVar122 + 0.5) *
                         fVar122 * fVar122) + fVar61;
                    auVar113 = maxps(auVar131,_DAT_00557e10);
                    fVar104 = (float)(auVar113._0_4_ & 0x807fffff | 0x3f000000);
                    fVar121 = (float)(auVar113._4_4_ & 0x807fffff | 0x3f000000);
                    fVar80 = (float)(auVar113._8_4_ & 0x807fffff | 0x3f000000);
                    fVar100 = (float)(auVar113._12_4_ & 0x807fffff | 0x3f000000);
                    fVar120 = fVar104 + -1.0 +
                              (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
                    fVar122 = fVar121 + -1.0 +
                              (float)(-(uint)(fVar121 < 0.70710677) & (uint)fVar121);
                    fVar96 = fVar80 + -1.0 + (float)(-(uint)(fVar80 < 0.70710677) & (uint)fVar80);
                    fVar102 = fVar100 + -1.0 +
                              (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar100);
                    auVar64._0_8_ =
                         CONCAT44(-(uint)(auVar131._4_4_ <= 0.0),-(uint)(auVar131._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar64._8_4_ = -(uint)(auVar131._8_4_ <= 0.0) & 0x7fffffff;
                    auVar64._12_4_ = -(uint)(auVar131._12_4_ <= 0.0) & 0x7fffffff;
                    auVar116._0_4_ =
                         ~-(uint)(auVar131._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar32)) * 0.6931472
                                 + fVar120 +
                                (((((((((fVar120 * 0.070376836 + -0.1151461) * fVar120 + 0.116769984
                                       ) * fVar120 + -0.12420141) * fVar120 + 0.14249323) * fVar120
                                    + -0.16668057) * fVar120 + 0.20000714) * fVar120 + -0.24999994)
                                  * fVar120 + 0.3333333) * fVar120 + -0.5) * fVar120 * fVar120) *
                               -2.0);
                    auVar116._4_4_ =
                         ~-(uint)(auVar131._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar121 < 0.70710677) & (uint)fVar59)) * 0.6931472
                                 + fVar122 +
                                (((((((((fVar122 * 0.070376836 + -0.1151461) * fVar122 + 0.116769984
                                       ) * fVar122 + -0.12420141) * fVar122 + 0.14249323) * fVar122
                                    + -0.16668057) * fVar122 + 0.20000714) * fVar122 + -0.24999994)
                                  * fVar122 + 0.3333333) * fVar122 + -0.5) * fVar122 * fVar122) *
                               -2.0);
                    auVar116._8_4_ =
                         ~-(uint)(auVar131._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar80 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                                 fVar96 + (((((((((fVar96 * 0.070376836 + -0.1151461) * fVar96 +
                                                 0.116769984) * fVar96 + -0.12420141) * fVar96 +
                                               0.14249323) * fVar96 + -0.16668057) * fVar96 +
                                             0.20000714) * fVar96 + -0.24999994) * fVar96 +
                                           0.3333333) * fVar96 + -0.5) * fVar96 * fVar96) * -2.0);
                    auVar116._12_4_ =
                         ~-(uint)(auVar131._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar100 < 0.70710677) & (uint)fVar61)) * 0.6931472
                                 + fVar102 +
                                (((((((((fVar102 * 0.070376836 + -0.1151461) * fVar102 + 0.116769984
                                       ) * fVar102 + -0.12420141) * fVar102 + 0.14249323) * fVar102
                                    + -0.16668057) * fVar102 + 0.20000714) * fVar102 + -0.24999994)
                                  * fVar102 + 0.3333333) * fVar102 + -0.5) * fVar102 * fVar102) *
                               -2.0);
                    auVar113 = minps(auVar116 | auVar64,_DAT_00557d60);
                    auVar113 = maxps(auVar113,_DAT_00557d70);
                    fVar80 = auVar113._0_4_ * 1.442695 + 0.5;
                    fVar96 = auVar113._4_4_ * 1.442695 + 0.5;
                    fVar100 = auVar113._8_4_ * 1.442695 + 0.5;
                    fVar102 = auVar113._12_4_ * 1.442695 + 0.5;
                    fVar104 = (float)(int)fVar80;
                    fVar120 = (float)(int)fVar96;
                    fVar121 = (float)(int)fVar100;
                    fVar122 = (float)(int)fVar102;
                    fVar104 = fVar104 - (float)(-(uint)(fVar80 < fVar104) & (uint)fVar32);
                    fVar120 = fVar120 - (float)(-(uint)(fVar96 < fVar120) & (uint)fVar59);
                    fVar121 = fVar121 - (float)(-(uint)(fVar100 < fVar121) & (uint)fVar60);
                    fVar122 = fVar122 - (float)(-(uint)(fVar102 < fVar122) & (uint)fVar61);
                    fVar80 = auVar113._0_4_ - fVar104 * 0.6931472;
                    fVar96 = auVar113._4_4_ - fVar120 * 0.6931472;
                    fVar100 = auVar113._8_4_ - fVar121 * 0.6931472;
                    fVar102 = auVar113._12_4_ - fVar122 * 0.6931472;
                    auVar65._0_4_ = fVar80 * fVar80;
                    auVar65._4_4_ = fVar96 * fVar96;
                    auVar65._8_4_ = fVar100 * fVar100;
                    auVar65._12_4_ = fVar102 * fVar102;
                    auVar88._0_4_ =
                         (float)((int)fVar104 * 0x800000 + (int)fVar32) *
                         (fVar80 + fVar32 +
                         (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) *
                            fVar80 + 0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5) *
                         auVar65._0_4_) + fVar32;
                    auVar88._4_4_ =
                         (float)((int)fVar120 * 0x800000 + (int)fVar59) *
                         (fVar96 + fVar59 +
                         (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) *
                            fVar96 + 0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5) *
                         auVar65._4_4_) + fVar59;
                    auVar88._8_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar60) *
                         (fVar100 + fVar60 +
                         (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) *
                            fVar100 + 0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5) *
                         auVar65._8_4_) + fVar60;
                    auVar88._12_4_ =
                         (float)((int)fVar122 * 0x800000 + (int)fVar61) *
                         (fVar102 + fVar61 +
                         (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) *
                            fVar102 + 0.041665796) * fVar102 + 0.16666666) * fVar102 + 0.5) *
                         auVar65._12_4_) + fVar61;
                    auVar113 = rcpps(auVar65,auVar88);
                    fVar104 = auVar113._0_4_;
                    fVar120 = auVar113._4_4_;
                    fVar121 = auVar113._8_4_;
                    fVar122 = auVar113._12_4_;
                    auVar45._0_4_ =
                         fVar63 * (fVar104 + fVar104 + -1.0 +
                                  (2.0 - auVar88._0_4_ * (fVar104 + fVar104)) * fVar104);
                    auVar45._4_4_ =
                         fVar75 * (fVar120 + fVar120 + -1.0 +
                                  (2.0 - auVar88._4_4_ * (fVar120 + fVar120)) * fVar120);
                    auVar45._8_4_ =
                         fVar77 * (fVar121 + fVar121 + -1.0 +
                                  (2.0 - auVar88._8_4_ * (fVar121 + fVar121)) * fVar121);
                    auVar45._12_4_ =
                         fVar79 * (fVar122 + fVar122 + -1.0 +
                                  (2.0 - auVar88._12_4_ * (fVar122 + fVar122)) * fVar122);
                    auVar113 = minps(auVar126,_DAT_00557d60);
                    auVar113 = maxps(auVar113,_DAT_00557d70);
                    fVar63 = auVar113._0_4_ * 1.442695 + 0.5;
                    fVar75 = auVar113._4_4_ * 1.442695 + 0.5;
                    fVar77 = auVar113._8_4_ * 1.442695 + 0.5;
                    fVar79 = auVar113._12_4_ * 1.442695 + 0.5;
                    fVar104 = (float)(int)fVar63;
                    fVar120 = (float)(int)fVar75;
                    fVar121 = (float)(int)fVar77;
                    fVar122 = (float)(int)fVar79;
                    fVar104 = fVar104 - (float)(-(uint)(fVar63 < fVar104) & (uint)fVar32);
                    fVar120 = fVar120 - (float)(-(uint)(fVar75 < fVar120) & (uint)fVar59);
                    fVar121 = fVar121 - (float)(-(uint)(fVar77 < fVar121) & (uint)fVar60);
                    fVar122 = fVar122 - (float)(-(uint)(fVar79 < fVar122) & (uint)fVar61);
                    fVar80 = (float)DAT_00557db0;
                    fVar96 = DAT_00557db0._4_4_;
                    fVar100 = DAT_00557db0._8_4_;
                    fVar102 = DAT_00557db0._12_4_;
                    fVar63 = auVar113._0_4_ - fVar104 * fVar80;
                    fVar75 = auVar113._4_4_ - fVar120 * fVar96;
                    fVar77 = auVar113._8_4_ - fVar121 * fVar100;
                    fVar79 = auVar113._12_4_ - fVar122 * fVar102;
                    auVar132._0_4_ =
                         (float)((int)fVar104 * 0x800000 + (int)fVar32) *
                         (fVar63 + fVar32 +
                         (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                            fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                         fVar63 * fVar63) + fVar32;
                    auVar132._4_4_ =
                         (float)((int)fVar120 * 0x800000 + (int)fVar59) *
                         (fVar75 + fVar59 +
                         (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) *
                         fVar75 * fVar75) + fVar59;
                    auVar132._8_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar60) *
                         (fVar77 + fVar60 +
                         (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) *
                            fVar77 + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) *
                         fVar77 * fVar77) + fVar60;
                    auVar132._12_4_ =
                         (float)((int)fVar122 * 0x800000 + (int)fVar61) *
                         (fVar79 + fVar61 +
                         (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) *
                            fVar79 + 0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) *
                         fVar79 * fVar79) + fVar61;
                    auVar113 = maxps(auVar132,_DAT_00557e10);
                    fVar63 = (float)(auVar113._0_4_ & 0x807fffff | 0x3f000000);
                    fVar77 = (float)(auVar113._4_4_ & 0x807fffff | 0x3f000000);
                    fVar104 = (float)(auVar113._8_4_ & 0x807fffff | 0x3f000000);
                    fVar121 = (float)(auVar113._12_4_ & 0x807fffff | 0x3f000000);
                    fVar75 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                    fVar79 = fVar77 + -1.0 + (float)(-(uint)(fVar77 < 0.70710677) & (uint)fVar77);
                    fVar120 = fVar104 + -1.0 +
                              (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
                    fVar122 = fVar121 + -1.0 +
                              (float)(-(uint)(fVar121 < 0.70710677) & (uint)fVar121);
                    auVar117._0_8_ =
                         CONCAT44(-(uint)(auVar132._4_4_ <= 0.0),-(uint)(auVar132._0_4_ <= 0.0)) &
                         0x7fffffff7fffffff;
                    auVar117._8_4_ = -(uint)(auVar132._8_4_ <= 0.0) & 0x7fffffff;
                    auVar117._12_4_ = -(uint)(auVar132._12_4_ <= 0.0) & 0x7fffffff;
                    auVar66._0_4_ =
                         ~-(uint)(auVar132._0_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._0_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar32)) * fVar80 +
                                 fVar75 + (((((((((fVar75 * 0.070376836 + -0.1151461) * fVar75 +
                                                 0.116769984) * fVar75 + -0.12420141) * fVar75 +
                                               0.14249323) * fVar75 + -0.16668057) * fVar75 +
                                             0.20000714) * fVar75 + -0.24999994) * fVar75 +
                                           0.3333333) * fVar75 + -0.5) * fVar75 * fVar75) * -2.0);
                    auVar66._4_4_ =
                         ~-(uint)(auVar132._4_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._4_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar77 < 0.70710677) & (uint)fVar59)) * fVar96 +
                                 fVar79 + (((((((((fVar79 * 0.070376836 + -0.1151461) * fVar79 +
                                                 0.116769984) * fVar79 + -0.12420141) * fVar79 +
                                               0.14249323) * fVar79 + -0.16668057) * fVar79 +
                                             0.20000714) * fVar79 + -0.24999994) * fVar79 +
                                           0.3333333) * fVar79 + -0.5) * fVar79 * fVar79) * -2.0);
                    auVar66._8_4_ =
                         ~-(uint)(auVar132._8_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._8_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar60)) * fVar100 +
                                 fVar120 +
                                (((((((((fVar120 * 0.070376836 + -0.1151461) * fVar120 + 0.116769984
                                       ) * fVar120 + -0.12420141) * fVar120 + 0.14249323) * fVar120
                                    + -0.16668057) * fVar120 + 0.20000714) * fVar120 + -0.24999994)
                                  * fVar120 + 0.3333333) * fVar120 + -0.5) * fVar120 * fVar120) *
                               -2.0);
                    auVar66._12_4_ =
                         ~-(uint)(auVar132._12_4_ <= 0.0) &
                         (uint)((((float)(int)((auVar113._12_4_ >> 0x17) - 0x7e) -
                                 (float)(-(uint)(fVar121 < 0.70710677) & (uint)fVar61)) * fVar102 +
                                 fVar122 +
                                (((((((((fVar122 * 0.070376836 + -0.1151461) * fVar122 + 0.116769984
                                       ) * fVar122 + -0.12420141) * fVar122 + 0.14249323) * fVar122
                                    + -0.16668057) * fVar122 + 0.20000714) * fVar122 + -0.24999994)
                                  * fVar122 + 0.3333333) * fVar122 + -0.5) * fVar122 * fVar122) *
                               -2.0);
                    auVar113 = minps(auVar66 | auVar117,_DAT_00557d60);
                    auVar113 = maxps(auVar113,_DAT_00557d70);
                    fVar63 = auVar113._0_4_ * 1.442695 + 0.5;
                    fVar75 = auVar113._4_4_ * 1.442695 + 0.5;
                    fVar77 = auVar113._8_4_ * 1.442695 + 0.5;
                    fVar79 = auVar113._12_4_ * 1.442695 + 0.5;
                    fVar104 = (float)(int)fVar63;
                    fVar120 = (float)(int)fVar75;
                    fVar121 = (float)(int)fVar77;
                    fVar122 = (float)(int)fVar79;
                    fVar104 = fVar104 - (float)(-(uint)(fVar63 < fVar104) & (uint)fVar32);
                    fVar120 = fVar120 - (float)(-(uint)(fVar75 < fVar120) & (uint)fVar59);
                    fVar121 = fVar121 - (float)(-(uint)(fVar77 < fVar121) & (uint)fVar60);
                    fVar122 = fVar122 - (float)(-(uint)(fVar79 < fVar122) & (uint)fVar61);
                    fVar63 = auVar113._0_4_ - fVar104 * fVar80;
                    fVar75 = auVar113._4_4_ - fVar120 * fVar96;
                    fVar77 = auVar113._8_4_ - fVar121 * fVar100;
                    fVar79 = auVar113._12_4_ - fVar122 * fVar102;
                    auVar67._0_4_ =
                         fVar63 + fVar32 +
                         (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) *
                            fVar63 + 0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) *
                         fVar63 * fVar63;
                    auVar67._4_4_ =
                         fVar75 + fVar59 +
                         (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                            fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) *
                         fVar75 * fVar75;
                    auVar67._8_4_ =
                         fVar77 + fVar60 +
                         (((((fVar77 * 0.00019875691 + 0.0013981999) * fVar77 + 0.008333452) *
                            fVar77 + 0.041665796) * fVar77 + 0.16666666) * fVar77 + 0.5) *
                         fVar77 * fVar77;
                    auVar67._12_4_ =
                         fVar79 + fVar61 +
                         (((((fVar79 * 0.00019875691 + 0.0013981999) * fVar79 + 0.008333452) *
                            fVar79 + 0.041665796) * fVar79 + 0.16666666) * fVar79 + 0.5) *
                         fVar79 * fVar79;
                    auVar118._0_4_ =
                         (float)((int)fVar104 * 0x800000 + (int)fVar32) * auVar67._0_4_ + fVar32;
                    auVar118._4_4_ =
                         (float)((int)fVar120 * 0x800000 + (int)fVar59) * auVar67._4_4_ + fVar59;
                    auVar118._8_4_ =
                         (float)((int)fVar121 * 0x800000 + (int)fVar60) * auVar67._8_4_ + fVar60;
                    auVar118._12_4_ =
                         (float)((int)fVar122 * 0x800000 + (int)fVar61) * auVar67._12_4_ + fVar61;
                    auVar113 = rcpps(auVar67,auVar118);
                    fVar63 = auVar113._0_4_;
                    fVar75 = auVar113._4_4_;
                    fVar77 = auVar113._8_4_;
                    fVar79 = auVar113._12_4_;
                    auVar126._0_4_ =
                         fVar81 * (fVar63 + fVar63 + -1.0 +
                                  (2.0 - auVar118._0_4_ * (fVar63 + fVar63)) * fVar63);
                    auVar126._4_4_ =
                         fVar97 * (fVar75 + fVar75 + -1.0 +
                                  (2.0 - auVar118._4_4_ * (fVar75 + fVar75)) * fVar75);
                    auVar126._8_4_ =
                         fVar101 * (fVar77 + fVar77 + -1.0 +
                                   (2.0 - auVar118._8_4_ * (fVar77 + fVar77)) * fVar77);
                    auVar126._12_4_ =
                         fVar103 * (fVar79 + fVar79 + -1.0 +
                                   (2.0 - auVar118._12_4_ * (fVar79 + fVar79)) * fVar79);
                    break;
                  case 6:
                    fVar104 = **(float **)(&this->field_0x118 + (long)p_Var24);
                    fVar120 = (*(float **)(&this->field_0x118 + (long)p_Var24))[1];
                    auVar119._0_4_ = fVar104 * fVar63 + fVar120;
                    auVar119._4_4_ = fVar104 * fVar75 + fVar120;
                    auVar119._8_4_ = fVar104 * fVar77 + fVar120;
                    auVar119._12_4_ = fVar104 * fVar79 + fVar120;
                    auVar113 = maxps(auVar119,auVar43);
                    auVar113 = minps(auVar113,auVar18);
                    auVar45._0_4_ = fVar63 * auVar113._0_4_;
                    auVar45._4_4_ = fVar75 * auVar113._4_4_;
                    auVar45._8_4_ = fVar77 * auVar113._8_4_;
                    auVar45._12_4_ = fVar79 * auVar113._12_4_;
                    auVar72._0_4_ = fVar104 * fVar81 + fVar120;
                    auVar72._4_4_ = fVar104 * fVar97 + fVar120;
                    auVar72._8_4_ = fVar104 * fVar101 + fVar120;
                    auVar72._12_4_ = fVar104 * fVar103 + fVar120;
                    auVar113 = maxps(auVar72,auVar43);
                    auVar113 = minps(auVar113,auVar18);
                    auVar126._0_4_ = fVar81 * auVar113._0_4_;
                    auVar126._4_4_ = fVar97 * auVar113._4_4_;
                    auVar126._8_4_ = fVar101 * auVar113._8_4_;
                    auVar126._12_4_ = fVar103 * auVar113._12_4_;
                  }
                  if (iVar25 < 0x65) {
                    *pauVar38 = auVar45;
                    pauVar38[1] = auVar126;
                    pauVar38 = pauVar38 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var24) +
                                      (long)local_2a0 * 0x20);
                    pfVar2 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var24) + 0x10 +
                                      (long)local_2a0 * 0x20);
                    fVar63 = *pfVar1 * auVar45._0_4_;
                    fVar75 = pfVar1[1] * auVar45._4_4_;
                    fVar77 = pfVar1[2] * auVar45._8_4_;
                    fVar79 = pfVar1[3] * auVar45._12_4_;
                    fVar81 = *pfVar2 * auVar126._0_4_;
                    fVar97 = pfVar2[1] * auVar126._4_4_;
                    fVar101 = pfVar2[2] * auVar126._8_4_;
                    fVar103 = pfVar2[3] * auVar126._12_4_;
                    auVar47._0_4_ = (int)((float)((uint)fVar63 & 0x80000000 | 0x3f000000) + fVar63);
                    auVar47._4_4_ = (int)((float)((uint)fVar75 & 0x80000000 | 0x3f000000) + fVar75);
                    auVar47._8_4_ = (int)((float)((uint)fVar77 & 0x80000000 | 0x3f000000) + fVar77);
                    auVar47._12_4_ = (int)((float)((uint)fVar79 & 0x80000000 | 0x3f000000) + fVar79)
                    ;
                    auVar73._0_4_ = (int)((float)((uint)fVar81 & 0x80000000 | 0x3f000000) + fVar81);
                    auVar73._4_4_ = (int)((float)((uint)fVar97 & 0x80000000 | 0x3f000000) + fVar97);
                    auVar73._8_4_ =
                         (int)((float)((uint)fVar101 & 0x80000000 | 0x3f000000) + fVar101);
                    auVar73._12_4_ =
                         (int)((float)((uint)fVar103 & 0x80000000 | 0x3f000000) + fVar103);
                    auVar113 = packssdw(auVar47,auVar73);
                    sVar128 = auVar113._0_2_;
                    uVar44 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    sVar128 = auVar113._2_2_;
                    uVar49 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    sVar128 = auVar113._4_2_;
                    uVar50 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    sVar128 = auVar113._6_2_;
                    uVar51 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    sVar128 = auVar113._8_2_;
                    uVar52 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    sVar128 = auVar113._10_2_;
                    uVar54 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    sVar128 = auVar113._12_2_;
                    sVar58 = auVar113._14_2_;
                    uVar55 = (ushort)(0x7f < sVar128) * 0x7f | (ushort)(0x7f >= sVar128) * sVar128;
                    uVar57 = (ushort)(0x7f < sVar58) * 0x7f | (ushort)(0x7f >= sVar58) * sVar58;
                    auVar48._0_2_ =
                         (ushort)((short)uVar44 < -0x7f) * -0x7f | ((short)uVar44 >= -0x7f) * uVar44
                    ;
                    auVar48._2_2_ =
                         (ushort)((short)uVar49 < -0x7f) * -0x7f | ((short)uVar49 >= -0x7f) * uVar49
                    ;
                    auVar48._4_2_ =
                         (ushort)((short)uVar50 < -0x7f) * -0x7f | ((short)uVar50 >= -0x7f) * uVar50
                    ;
                    auVar48._6_2_ =
                         (ushort)((short)uVar51 < -0x7f) * -0x7f | ((short)uVar51 >= -0x7f) * uVar51
                    ;
                    auVar48._8_2_ =
                         (ushort)((short)uVar52 < -0x7f) * -0x7f | ((short)uVar52 >= -0x7f) * uVar52
                    ;
                    auVar48._10_2_ =
                         (ushort)((short)uVar54 < -0x7f) * -0x7f | ((short)uVar54 >= -0x7f) * uVar54
                    ;
                    auVar48._12_2_ =
                         (ushort)((short)uVar55 < -0x7f) * -0x7f | ((short)uVar55 >= -0x7f) * uVar55
                    ;
                    auVar48._14_2_ =
                         (ushort)((short)uVar57 < -0x7f) * -0x7f | ((short)uVar57 >= -0x7f) * uVar57
                    ;
                    auVar113 = packsswb(auVar48,auVar48);
                    *(long *)*pauVar34 = auVar113._0_8_;
                    pauVar34 = (undefined1 (*) [16])((long)*pauVar34 + 8);
                  }
                  bVar42 = iVar35 != iVar29;
                  iVar35 = iVar35 + 1;
                } while (bVar42);
              }
              pp_Var23 = (_func_int **)(ulong)(iVar28 + 1);
            } while (iVar28 != (int)local_248);
          }
          local_2a0 = (pointer)((long)local_2a0 + 1);
          iVar37 = iVar37 + iVar31;
        } while (local_2a0 != local_240);
      }
      if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
        uVar39 = local_2f8._16_8_ - local_2f8._0_8_;
LAB_003d06a8:
        operator_delete((void *)local_2f8._0_8_,uVar39);
      }
    }
    iVar27 = 0;
    goto LAB_003d0791;
  }
  uVar21 = *(uint *)(&this->field_0xd0 + (long)p_Var24);
  iVar29 = *(int *)(&this->field_0x10c + (long)p_Var24);
  local_2a8 = (_func_int **)0x1;
  if (opt->use_packing_layout == true) {
    if (iVar29 < 0x65) {
      local_2a8 = (_func_int **)(ulong)((uint)((uVar21 & 3) == 0) * 3 + 1);
    }
    else {
      local_2a8 = (_func_int **)0x1;
      if ((uVar21 & 7) == 0) {
        local_2a8 = (_func_int **)0x8;
      }
    }
  }
  iVar25 = (int)local_2a8;
  pp_Var22 = (_func_int **)(ulong)(uint)(iVar25 * 4);
  if (100 < iVar29) {
    pp_Var22 = local_2a8;
  }
  Mat::create(top_blob,iVar31,iVar37,(int)uVar21 / iVar25,(size_t)pp_Var22,iVar25,
              opt->blob_allocator);
  auVar18 = stack0xfffffffffffffd38;
  iVar27 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003d0791;
  uVar30 = (int)uVar30 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  uVar21 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  iVar25 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar25 = 1;
    if ((uVar30 & 7) == 0) {
      iVar25 = 8;
    }
    if (iVar29 < 0x65) {
      _elempack = (uint)((uVar21 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar21 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  local_2f8._8_8_ = CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  local_2f8._0_8_ = local_238.data;
  local_2f8._16_8_ = CONCAT44(local_238.elemsize._4_4_,(undefined4)local_238.elemsize);
  local_2f8._24_4_ = local_238.elempack;
  local_2f8._32_8_ = local_238.allocator;
  local_2f8._44_4_ = local_238.w;
  local_2f8._40_4_ = local_238.dims;
  iStack_2c4 = local_238.d;
  local_2f8._48_4_ = local_238.h;
  uStack_2bc = auVar18._12_4_;
  iStack_2c0 = local_238.c;
  local_2b8 = local_238.cstep;
  if ((Allocator *)local_2f8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)&((Allocator *)local_2f8._8_8_)->_vptr_Allocator =
         *(int *)&((Allocator *)local_2f8._8_8_)->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (iVar25 < iVar28) {
    local_298.data = *(void **)opt;
    local_298.elemsize = (size_t)opt->workspace_allocator;
    local_298.elempack = opt->openmp_blocktime;
    local_298._28_1_ = opt->use_winograd_convolution;
    local_298._29_1_ = opt->use_sgemm_convolution;
    local_298._30_1_ = opt->use_int8_inference;
    local_298._31_1_ = opt->use_vulkan_compute;
    local_298.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_298._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_298._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_298._56_8_ = *(undefined8 *)&opt->use_winograd43_convolution;
    local_298.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_238,(Mat *)local_2f8,iVar25,(Option *)&local_298);
  }
  local_298.data = top_blob->data;
  local_298.refcount = top_blob->refcount;
  local_298.elemsize = top_blob->elemsize;
  local_298.elempack = top_blob->elempack;
  local_298.allocator = top_blob->allocator;
  local_298.dims = top_blob->dims;
  local_298.w = top_blob->w;
  local_298.h = top_blob->h;
  local_298.d = top_blob->d;
  local_298.c = top_blob->c;
  local_298.cstep = top_blob->cstep;
  if (local_298.refcount != (int *)0x0) {
    LOCK();
    *local_298.refcount = *local_298.refcount + 1;
    UNLOCK();
  }
  pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
  if (_elempack < (uint)local_2a8) {
    Mat::create(&local_298,iVar31,iVar37,
                *(int *)(&this->field_0xd0 + (long)pp_Var23[-3]) / (int)_elempack,
                (ulong)((byte)((ushort)pp_Var22 / (ushort)(byte)local_2a8) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar27 = -100;
    if ((local_298.data != (void *)0x0) && ((long)local_298.c * local_298.cstep != 0)) {
      pp_Var23 = this->_vptr_ConvolutionDepthWise_x86;
      goto LAB_003cfb5b;
    }
  }
  else {
LAB_003cfb5b:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var23[-3])) {
      iVar29 = 0;
      iVar37 = 0;
      lVar36 = 0;
      do {
        local_1d8 = (pointer)((long)(iVar29 / iVar25) * local_2b8 * local_2f8._16_8_ +
                             local_2f8._0_8_);
        local_1d0 = (int *)0x0;
        local_1c8 = (Allocator *)local_2f8._16_8_;
        local_1c0 = local_2f8._24_4_;
        local_1b8 = (Allocator *)local_2f8._32_8_;
        local_1ac = local_2f8._44_4_;
        local_1a8 = local_2f8._48_4_;
        local_1a4 = iStack_2c4;
        local_198 = ((long)iStack_2c4 * local_2f8._16_8_ *
                     (long)(int)local_2f8._48_4_ * (long)(int)local_2f8._44_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)local_2f8._16_8_;
        local_1b0 = local_2f8._40_4_;
        local_178 = (void *)((long)(iVar37 / (int)_elempack) * local_298.cstep * local_298.elemsize
                            + (long)local_298.data);
        local_170 = (int *)0x0;
        local_168 = local_298.elemsize;
        local_160 = local_298.elempack;
        local_158 = local_298.allocator;
        local_14c = local_298.w;
        local_148 = local_298.h;
        local_144 = local_298.d;
        local_138 = ((long)local_298.d * local_298.elemsize * (long)local_298.h * (long)local_298.w
                     + 0xf & 0xfffffffffffffff0) / local_298.elemsize;
        local_150 = local_298.dims;
        pLVar10 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar36];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        local_68 = *(undefined4 *)&opt->workspace_allocator;
        uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        iStack_60 = opt->openmp_blocktime;
        uStack_5c._0_1_ = opt->use_winograd_convolution;
        uStack_5c._1_1_ = opt->use_sgemm_convolution;
        uStack_5c._2_1_ = opt->use_int8_inference;
        uStack_5c._3_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        uStack_54._0_1_ = opt->use_int8_packed;
        uStack_54._1_1_ = opt->use_int8_storage;
        uStack_54._2_1_ = opt->use_int8_arithmetic;
        uStack_54._3_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_4c._0_1_ = opt->use_subgroup_shuffle;
        uStack_4c._1_1_ = opt->use_image_storage;
        uStack_4c._2_1_ = opt->use_tensor_storage;
        uStack_4c._3_1_ = opt->use_reserved_0;
        local_48._0_4_ = opt->flush_denormals;
        local_48._4_1_ = opt->use_local_pool_allocator;
        local_48._5_1_ = opt->use_shader_local_memory;
        local_48._6_1_ = opt->use_cooperative_matrix;
        local_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = local_298.allocator;
        local_1a0 = (int)uVar30 / iVar25;
        local_140 = (int)uVar21 / (int)_elempack;
        (*pLVar10->_vptr_Layer[7])(pLVar10,&local_1d8,&local_178);
        if (local_170 != (int *)0x0) {
          LOCK();
          *local_170 = *local_170 + -1;
          UNLOCK();
          if (*local_170 == 0) {
            if (local_158 == (Allocator *)0x0) {
              if (local_178 != (void *)0x0) {
                free(local_178);
              }
            }
            else {
              (*local_158->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1d0 != (int *)0x0) {
          LOCK();
          *local_1d0 = *local_1d0 + -1;
          UNLOCK();
          if (*local_1d0 == 0) {
            if (local_1b8 == (Allocator *)0x0) {
              if (local_1d8 != (pointer)0x0) {
                free(local_1d8);
              }
            }
            else {
              (*local_1b8->_vptr_Allocator[3])();
            }
          }
        }
        lVar36 = lVar36 + 1;
        iVar37 = iVar37 + uVar21;
        iVar29 = iVar29 + uVar30;
      } while (lVar36 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]
                                ));
    }
    if (_elempack < (uint)local_2a8) {
      convert_packing(&local_298,top_blob,(uint)local_2a8,opt);
      iVar27 = 0;
    }
    else {
      iVar27 = 0;
      if (&local_298 != top_blob) {
        if (local_298.refcount != (int *)0x0) {
          LOCK();
          *local_298.refcount = *local_298.refcount + 1;
          UNLOCK();
        }
        piVar9 = top_blob->refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar27 = 0;
        top_blob->data = local_298.data;
        top_blob->refcount = local_298.refcount;
        top_blob->elemsize = local_298.elemsize;
        top_blob->elempack = local_298.elempack;
        top_blob->allocator = local_298.allocator;
        top_blob->dims = local_298.dims;
        top_blob->w = local_298.w;
        top_blob->h = local_298.h;
        top_blob->d = local_298.d;
        top_blob->c = local_298.c;
        top_blob->cstep = local_298.cstep;
      }
    }
  }
  if (local_298.refcount != (int *)0x0) {
    LOCK();
    *local_298.refcount = *local_298.refcount + -1;
    UNLOCK();
    if (*local_298.refcount == 0) {
      if (local_298.allocator == (Allocator *)0x0) {
        if (local_298.data != (void *)0x0) {
          free(local_298.data);
        }
      }
      else {
        (*(local_298.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_2f8._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_2f8._8_8_ = *(int *)(_func_int ***)local_2f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_2f8._8_8_ == 0) {
      if ((Allocator *)local_2f8._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          free((void *)local_2f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2f8._32_8_)[3])();
      }
    }
  }
LAB_003d0791:
  piVar9 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_238.allocator == (Allocator *)0x0) {
        if ((pointer)local_238.data != (pointer)0x0) {
          free(local_238.data);
        }
      }
      else {
        (*(local_238.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_130.refcount != (int *)0x0) {
    LOCK();
    *local_130.refcount = *local_130.refcount + -1;
    UNLOCK();
    if (*local_130.refcount == 0) {
      if (local_130.allocator == (Allocator *)0x0) {
        if (local_130.data != (void *)0x0) {
          free(local_130.data);
        }
      }
      else {
        (*(local_130.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int ConvolutionDepthWise_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}